

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variable_comparison_suite.cpp
# Opt level: O1

void equality_suite::compare_null_equal_string_literal(void)

{
  bool bVar1;
  undefined1 local_4a;
  undefined1 local_49;
  type local_48;
  undefined1 local_28;
  
  local_28 = 0;
  local_48._0_4_ = 0;
  local_49 = trial::dynamic::detail::
             operator_overloader<trial::dynamic::basic_variable<std::allocator<char>_>,_char[1],_void>
             ::equal((variable_type *)&local_48.__align,"");
  local_4a = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("variable() == \"\"","false",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0x86,"void equality_suite::compare_null_equal_string_literal()",&local_49,&local_4a);
  trial::dynamic::detail::
  small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,max_align_t,unsigned_char,trial::dynamic::nullable,bool,signed_char,unsigned_char,short,unsigned_short,int,unsigned_int,long,unsigned_long,long_long,unsigned_long_long,float,double,long_double,std::__cxx11::string,std::__cxx11::wstring,std::__cxx11::u16string,std::__cxx11::u32string,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>,std::map<trial::dynamic::basic_variable<std::allocator<char>>,trial::dynamic::basic_variable<std::allocator<char>>,std::less<trial::dynamic::basic_variable<std::allocator<char>>>,std::allocator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>>
  ::
  call<trial::dynamic::detail::small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,max_align_t,unsigned_char,trial::dynamic::nullable,bool,signed_char,unsigned_char,short,unsigned_short,int,unsigned_int,long,unsigned_long,long_long,unsigned_long_long,float,double,long_double,std::__cxx11::string,std::__cxx11::wstring,std::__cxx11::u16string,std::__cxx11::u32string,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>,std::map<trial::dynamic::basic_variable<std::allocator<char>>,trial::dynamic::basic_variable<std::allocator<char>>,std::less<trial::dynamic::basic_variable<std::allocator<char>>>,std::allocator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>>::destructor,void>
            ((small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,max_align_t,unsigned_char,trial::dynamic::nullable,bool,signed_char,unsigned_char,short,unsigned_short,int,unsigned_int,long,unsigned_long,long_long,unsigned_long_long,float,double,long_double,std::__cxx11::string,std::__cxx11::wstring,std::__cxx11::u16string,std::__cxx11::u32string,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>,std::map<trial::dynamic::basic_variable<std::allocator<char>>,trial::dynamic::basic_variable<std::allocator<char>>,std::less<trial::dynamic::basic_variable<std::allocator<char>>>,std::allocator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>>
              *)&local_48.__align);
  local_28 = 0;
  local_48._0_4_ = 0;
  bVar1 = trial::dynamic::detail::
          operator_overloader<trial::dynamic::basic_variable<std::allocator<char>_>,_char[1],_void>
          ::equal((variable_type *)&local_48.__align,"");
  local_49 = !bVar1;
  local_4a = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("variable() != \"\"","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0x87,"void equality_suite::compare_null_equal_string_literal()",&local_49,&local_4a);
  trial::dynamic::detail::
  small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,max_align_t,unsigned_char,trial::dynamic::nullable,bool,signed_char,unsigned_char,short,unsigned_short,int,unsigned_int,long,unsigned_long,long_long,unsigned_long_long,float,double,long_double,std::__cxx11::string,std::__cxx11::wstring,std::__cxx11::u16string,std::__cxx11::u32string,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>,std::map<trial::dynamic::basic_variable<std::allocator<char>>,trial::dynamic::basic_variable<std::allocator<char>>,std::less<trial::dynamic::basic_variable<std::allocator<char>>>,std::allocator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>>
  ::
  call<trial::dynamic::detail::small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,max_align_t,unsigned_char,trial::dynamic::nullable,bool,signed_char,unsigned_char,short,unsigned_short,int,unsigned_int,long,unsigned_long,long_long,unsigned_long_long,float,double,long_double,std::__cxx11::string,std::__cxx11::wstring,std::__cxx11::u16string,std::__cxx11::u32string,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>,std::map<trial::dynamic::basic_variable<std::allocator<char>>,trial::dynamic::basic_variable<std::allocator<char>>,std::less<trial::dynamic::basic_variable<std::allocator<char>>>,std::allocator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>>::destructor,void>
            ((small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,max_align_t,unsigned_char,trial::dynamic::nullable,bool,signed_char,unsigned_char,short,unsigned_short,int,unsigned_int,long,unsigned_long,long_long,unsigned_long_long,float,double,long_double,std::__cxx11::string,std::__cxx11::wstring,std::__cxx11::u16string,std::__cxx11::u32string,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>,std::map<trial::dynamic::basic_variable<std::allocator<char>>,trial::dynamic::basic_variable<std::allocator<char>>,std::less<trial::dynamic::basic_variable<std::allocator<char>>>,std::allocator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>>
              *)&local_48.__align);
  local_28 = 0;
  local_48._0_4_ = 0;
  local_49 = trial::dynamic::detail::
             operator_overloader<trial::dynamic::basic_variable<std::allocator<char>_>,_char[6],_void>
             ::equal((variable_type *)&local_48.__align,"alpha");
  local_4a = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("variable() == \"alpha\"","false",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0x89,"void equality_suite::compare_null_equal_string_literal()",&local_49,&local_4a);
  trial::dynamic::detail::
  small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,max_align_t,unsigned_char,trial::dynamic::nullable,bool,signed_char,unsigned_char,short,unsigned_short,int,unsigned_int,long,unsigned_long,long_long,unsigned_long_long,float,double,long_double,std::__cxx11::string,std::__cxx11::wstring,std::__cxx11::u16string,std::__cxx11::u32string,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>,std::map<trial::dynamic::basic_variable<std::allocator<char>>,trial::dynamic::basic_variable<std::allocator<char>>,std::less<trial::dynamic::basic_variable<std::allocator<char>>>,std::allocator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>>
  ::
  call<trial::dynamic::detail::small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,max_align_t,unsigned_char,trial::dynamic::nullable,bool,signed_char,unsigned_char,short,unsigned_short,int,unsigned_int,long,unsigned_long,long_long,unsigned_long_long,float,double,long_double,std::__cxx11::string,std::__cxx11::wstring,std::__cxx11::u16string,std::__cxx11::u32string,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>,std::map<trial::dynamic::basic_variable<std::allocator<char>>,trial::dynamic::basic_variable<std::allocator<char>>,std::less<trial::dynamic::basic_variable<std::allocator<char>>>,std::allocator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>>::destructor,void>
            ((small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,max_align_t,unsigned_char,trial::dynamic::nullable,bool,signed_char,unsigned_char,short,unsigned_short,int,unsigned_int,long,unsigned_long,long_long,unsigned_long_long,float,double,long_double,std::__cxx11::string,std::__cxx11::wstring,std::__cxx11::u16string,std::__cxx11::u32string,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>,std::map<trial::dynamic::basic_variable<std::allocator<char>>,trial::dynamic::basic_variable<std::allocator<char>>,std::less<trial::dynamic::basic_variable<std::allocator<char>>>,std::allocator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>>
              *)&local_48.__align);
  local_28 = 0;
  local_48._0_4_ = 0;
  bVar1 = trial::dynamic::detail::
          operator_overloader<trial::dynamic::basic_variable<std::allocator<char>_>,_char[6],_void>
          ::equal((variable_type *)&local_48.__align,"alpha");
  local_49 = !bVar1;
  local_4a = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("variable() != \"alpha\"","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0x8a,"void equality_suite::compare_null_equal_string_literal()",&local_49,&local_4a);
  trial::dynamic::detail::
  small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,max_align_t,unsigned_char,trial::dynamic::nullable,bool,signed_char,unsigned_char,short,unsigned_short,int,unsigned_int,long,unsigned_long,long_long,unsigned_long_long,float,double,long_double,std::__cxx11::string,std::__cxx11::wstring,std::__cxx11::u16string,std::__cxx11::u32string,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>,std::map<trial::dynamic::basic_variable<std::allocator<char>>,trial::dynamic::basic_variable<std::allocator<char>>,std::less<trial::dynamic::basic_variable<std::allocator<char>>>,std::allocator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>>
  ::
  call<trial::dynamic::detail::small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,max_align_t,unsigned_char,trial::dynamic::nullable,bool,signed_char,unsigned_char,short,unsigned_short,int,unsigned_int,long,unsigned_long,long_long,unsigned_long_long,float,double,long_double,std::__cxx11::string,std::__cxx11::wstring,std::__cxx11::u16string,std::__cxx11::u32string,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>,std::map<trial::dynamic::basic_variable<std::allocator<char>>,trial::dynamic::basic_variable<std::allocator<char>>,std::less<trial::dynamic::basic_variable<std::allocator<char>>>,std::allocator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>>::destructor,void>
            ((small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,max_align_t,unsigned_char,trial::dynamic::nullable,bool,signed_char,unsigned_char,short,unsigned_short,int,unsigned_int,long,unsigned_long,long_long,unsigned_long_long,float,double,long_double,std::__cxx11::string,std::__cxx11::wstring,std::__cxx11::u16string,std::__cxx11::u32string,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>,std::map<trial::dynamic::basic_variable<std::allocator<char>>,trial::dynamic::basic_variable<std::allocator<char>>,std::less<trial::dynamic::basic_variable<std::allocator<char>>>,std::allocator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>>
              *)&local_48.__align);
  return;
}

Assistant:

void compare_null_equal_string_literal()
{
    TRIAL_PROTOCOL_TEST_EQUAL(variable() == "", false);
    TRIAL_PROTOCOL_TEST_EQUAL(variable() != "", true);

    TRIAL_PROTOCOL_TEST_EQUAL(variable() == "alpha", false);
    TRIAL_PROTOCOL_TEST_EQUAL(variable() != "alpha", true);
}